

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# BitstreamEncoder.cpp
# Opt level: O0

bool generate_special(TrackData *trackdata)

{
  pointer pSVar1;
  bool bVar2;
  Track *pTVar3;
  TrackData local_838;
  TrackData local_780;
  TrackData local_6c8;
  TrackData local_610;
  TrackData local_558;
  TrackData local_4a0;
  TrackData local_3e8;
  TrackData local_330;
  TrackData local_278;
  TrackData local_1c0;
  TrackData local_108;
  int local_40;
  int local_3c;
  int weak_size;
  int weak_offset;
  Track track;
  TrackData *trackdata_local;
  
  track.m_sectors.super__Vector_base<Sector,_std::allocator<Sector>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)trackdata;
  pTVar3 = TrackData::track(trackdata);
  Track::Track((Track *)&weak_size,pTVar3);
  local_3c = 0;
  local_40 = 0;
  bVar2 = IsEmptyTrack((Track *)&weak_size);
  pSVar1 = track.m_sectors.super__Vector_base<Sector,_std::allocator<Sector>_>._M_impl.
           super__Vector_impl_data._M_end_of_storage;
  if (bVar2) {
    GenerateEmptyTrack(&local_108,
                       (CylHead *)
                       track.m_sectors.super__Vector_base<Sector,_std::allocator<Sector>_>._M_impl.
                       super__Vector_impl_data._M_end_of_storage,(Track *)&weak_size);
    TrackData::add((TrackData *)pSVar1,&local_108);
    TrackData::~TrackData(&local_108);
  }
  else {
    bVar2 = IsKBI19Track((Track *)&weak_size);
    pSVar1 = track.m_sectors.super__Vector_base<Sector,_std::allocator<Sector>_>._M_impl.
             super__Vector_impl_data._M_end_of_storage;
    if (bVar2) {
      GenerateKBI19Track(&local_1c0,
                         (CylHead *)
                         track.m_sectors.super__Vector_base<Sector,_std::allocator<Sector>_>._M_impl
                         .super__Vector_impl_data._M_end_of_storage,(Track *)&weak_size);
      TrackData::add((TrackData *)pSVar1,&local_1c0);
      TrackData::~TrackData(&local_1c0);
    }
    else {
      bVar2 = IsSystem24Track((Track *)&weak_size);
      pSVar1 = track.m_sectors.super__Vector_base<Sector,_std::allocator<Sector>_>._M_impl.
               super__Vector_impl_data._M_end_of_storage;
      if (bVar2) {
        GenerateSystem24Track
                  (&local_278,
                   (CylHead *)
                   track.m_sectors.super__Vector_base<Sector,_std::allocator<Sector>_>._M_impl.
                   super__Vector_impl_data._M_end_of_storage,(Track *)&weak_size);
        TrackData::add((TrackData *)pSVar1,&local_278);
        TrackData::~TrackData(&local_278);
      }
      else {
        bVar2 = IsSpectrumSpeedlockTrack((Track *)&weak_size,&local_3c,&local_40);
        pSVar1 = track.m_sectors.super__Vector_base<Sector,_std::allocator<Sector>_>._M_impl.
                 super__Vector_impl_data._M_end_of_storage;
        if (bVar2) {
          GenerateSpectrumSpeedlockTrack
                    (&local_330,
                     (CylHead *)
                     track.m_sectors.super__Vector_base<Sector,_std::allocator<Sector>_>._M_impl.
                     super__Vector_impl_data._M_end_of_storage,(Track *)&weak_size,local_3c,local_40
                    );
          TrackData::add((TrackData *)pSVar1,&local_330);
          TrackData::~TrackData(&local_330);
        }
        else {
          bVar2 = IsCpcSpeedlockTrack((Track *)&weak_size,&local_3c,&local_40);
          pSVar1 = track.m_sectors.super__Vector_base<Sector,_std::allocator<Sector>_>._M_impl.
                   super__Vector_impl_data._M_end_of_storage;
          if (bVar2) {
            GenerateCpcSpeedlockTrack
                      (&local_3e8,
                       (CylHead *)
                       track.m_sectors.super__Vector_base<Sector,_std::allocator<Sector>_>._M_impl.
                       super__Vector_impl_data._M_end_of_storage,(Track *)&weak_size,local_3c,
                       local_40);
            TrackData::add((TrackData *)pSVar1,&local_3e8);
            TrackData::~TrackData(&local_3e8);
          }
          else {
            bVar2 = IsRainbowArtsTrack((Track *)&weak_size,&local_3c,&local_40);
            pSVar1 = track.m_sectors.super__Vector_base<Sector,_std::allocator<Sector>_>._M_impl.
                     super__Vector_impl_data._M_end_of_storage;
            if (bVar2) {
              GenerateRainbowArtsTrack
                        (&local_4a0,
                         (CylHead *)
                         track.m_sectors.super__Vector_base<Sector,_std::allocator<Sector>_>._M_impl
                         .super__Vector_impl_data._M_end_of_storage,(Track *)&weak_size,local_3c,
                         local_40);
              TrackData::add((TrackData *)pSVar1,&local_4a0);
              TrackData::~TrackData(&local_4a0);
            }
            else {
              bVar2 = IsKBIWeakSectorTrack((Track *)&weak_size,&local_3c,&local_40);
              pSVar1 = track.m_sectors.super__Vector_base<Sector,_std::allocator<Sector>_>._M_impl.
                       super__Vector_impl_data._M_end_of_storage;
              if (bVar2) {
                GenerateKBIWeakSectorTrack
                          (&local_558,
                           (CylHead *)
                           track.m_sectors.super__Vector_base<Sector,_std::allocator<Sector>_>.
                           _M_impl.super__Vector_impl_data._M_end_of_storage,(Track *)&weak_size,
                           local_3c,local_40);
                TrackData::add((TrackData *)pSVar1,&local_558);
                TrackData::~TrackData(&local_558);
              }
              else {
                bVar2 = IsLogoProfTrack((Track *)&weak_size);
                pSVar1 = track.m_sectors.super__Vector_base<Sector,_std::allocator<Sector>_>._M_impl
                         .super__Vector_impl_data._M_end_of_storage;
                if (bVar2) {
                  GenerateLogoProfTrack
                            (&local_610,
                             (CylHead *)
                             track.m_sectors.super__Vector_base<Sector,_std::allocator<Sector>_>.
                             _M_impl.super__Vector_impl_data._M_end_of_storage,(Track *)&weak_size);
                  TrackData::add((TrackData *)pSVar1,&local_610);
                  TrackData::~TrackData(&local_610);
                }
                else {
                  bVar2 = IsOperaSoftTrack((Track *)&weak_size);
                  pSVar1 = track.m_sectors.super__Vector_base<Sector,_std::allocator<Sector>_>.
                           _M_impl.super__Vector_impl_data._M_end_of_storage;
                  if (bVar2) {
                    GenerateOperaSoftTrack
                              (&local_6c8,
                               (CylHead *)
                               track.m_sectors.super__Vector_base<Sector,_std::allocator<Sector>_>.
                               _M_impl.super__Vector_impl_data._M_end_of_storage,(Track *)&weak_size
                              );
                    TrackData::add((TrackData *)pSVar1,&local_6c8);
                    TrackData::~TrackData(&local_6c8);
                  }
                  else {
                    bVar2 = Is8KSectorTrack((Track *)&weak_size);
                    pSVar1 = track.m_sectors.super__Vector_base<Sector,_std::allocator<Sector>_>.
                             _M_impl.super__Vector_impl_data._M_end_of_storage;
                    if (bVar2) {
                      Generate8KSectorTrack
                                (&local_780,
                                 (CylHead *)
                                 track.m_sectors.super__Vector_base<Sector,_std::allocator<Sector>_>
                                 ._M_impl.super__Vector_impl_data._M_end_of_storage,
                                 (Track *)&weak_size);
                      TrackData::add((TrackData *)pSVar1,&local_780);
                      TrackData::~TrackData(&local_780);
                    }
                    else {
                      bVar2 = Is11SectorTrack((Track *)&weak_size);
                      pSVar1 = track.m_sectors.super__Vector_base<Sector,_std::allocator<Sector>_>.
                               _M_impl.super__Vector_impl_data._M_end_of_storage;
                      if (!bVar2) {
                        trackdata_local._7_1_ = false;
                        goto LAB_001cd824;
                      }
                      Generate11SectorTrack
                                (&local_838,
                                 (CylHead *)
                                 track.m_sectors.super__Vector_base<Sector,_std::allocator<Sector>_>
                                 ._M_impl.super__Vector_impl_data._M_end_of_storage,
                                 (Track *)&weak_size);
                      TrackData::add((TrackData *)pSVar1,&local_838);
                      TrackData::~TrackData(&local_838);
                    }
                  }
                }
              }
            }
          }
        }
      }
    }
  }
  trackdata_local._7_1_ = true;
LAB_001cd824:
  Track::~Track((Track *)&weak_size);
  return trackdata_local._7_1_;
}

Assistant:

bool generate_special(TrackData& trackdata)
{
    auto track{ trackdata.track() };
    int weak_offset{ 0 }, weak_size{ 0 };

    // Special formats have special conversions
    if (IsEmptyTrack(track))
        trackdata.add(GenerateEmptyTrack(trackdata.cylhead, track));
    else if (IsKBI19Track(track))
        trackdata.add(GenerateKBI19Track(trackdata.cylhead, track));
    else if (IsSystem24Track(track))
        trackdata.add(GenerateSystem24Track(trackdata.cylhead, track));
    else if (IsSpectrumSpeedlockTrack(track, weak_offset, weak_size))
        trackdata.add(GenerateSpectrumSpeedlockTrack(trackdata.cylhead, track, weak_offset, weak_size));
    else if (IsCpcSpeedlockTrack(track, weak_offset, weak_size))
        trackdata.add(GenerateCpcSpeedlockTrack(trackdata.cylhead, track, weak_offset, weak_size));
    else if (IsRainbowArtsTrack(track, weak_offset, weak_size))
        trackdata.add(GenerateRainbowArtsTrack(trackdata.cylhead, track, weak_offset, weak_size));
    else if (IsKBIWeakSectorTrack(track, weak_offset, weak_size))
        trackdata.add(GenerateKBIWeakSectorTrack(trackdata.cylhead, track, weak_offset, weak_size));
    else if (IsLogoProfTrack(track))
        trackdata.add(GenerateLogoProfTrack(trackdata.cylhead, track));
    else if (IsOperaSoftTrack(track))
        trackdata.add(GenerateOperaSoftTrack(trackdata.cylhead, track));
    else if (Is8KSectorTrack(track))
        trackdata.add(Generate8KSectorTrack(trackdata.cylhead, track));
    else if (Is11SectorTrack(track))
        trackdata.add(Generate11SectorTrack(trackdata.cylhead, track));
    else
        return false;

    return true;
}